

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.c
# Opt level: O0

void path_remove(path_state_t *state)

{
  list_node_t *node_00;
  list_node_t *node;
  path_state_t *state_local;
  
  node_00 = (state->path_list).tail;
  free(node_00->data);
  list_del(&state->path_list,node_00);
  if ((state->path_list).head == (list_node_t *)0x0) {
    fprintf(_stderr,"%s: removed last element from path\n",state->program_name);
    exit(1);
  }
  return;
}

Assistant:

void
path_remove(
    path_state_t* state)
{
    list_node_t* node = state->path_list.tail;
    free(node->data);
    list_del(&state->path_list, node);
    if (state->path_list.head == NULL) {
        fprintf(stderr, "%s: removed last element from path\n", state->program_name);
        exit(1);
    }
}